

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prompts.c
# Opt level: O2

prompts_t * new_prompts(void)

{
  prompts_t *ppVar1;
  
  ppVar1 = (prompts_t *)safemalloc(1,0x80,0);
  ppVar1->n_prompts = 0;
  ppVar1->prompts_size = 0;
  ppVar1->prompts = (prompt_t **)0x0;
  ppVar1->data = (void *)0x0;
  (ppVar1->spr).kind = SPRK_INCOMPLETE;
  (ppVar1->spr).errdata_lit = (char *)0x0;
  ppVar1->to_server = true;
  ppVar1->instruction = (char *)0x0;
  ppVar1->name = (char *)0x0;
  ppVar1->instr_reqd = false;
  ppVar1->name_reqd = false;
  ppVar1->callback = (toplevel_callback_fn_t)0x0;
  ppVar1->callback_ctx = (void *)0x0;
  ppVar1->ldisc_ptr_to_us = (prompts_t **)0x0;
  return ppVar1;
}

Assistant:

prompts_t *new_prompts(void)
{
    prompts_t *p = snew(prompts_t);
    p->prompts = NULL;
    p->n_prompts = p->prompts_size = 0;
    p->data = NULL;
    p->spr = SPR_INCOMPLETE;
    p->to_server = true; /* to be on the safe side */
    p->name = p->instruction = NULL;
    p->name_reqd = p->instr_reqd = false;
    p->callback = NULL;
    p->callback_ctx = NULL;
    p->ldisc_ptr_to_us = NULL;
    return p;
}